

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processMSG(UA_Server *server,UA_SecureChannel *channel,UA_UInt32 requestId,UA_ByteString *msg)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  UA_Logger p_Var10;
  long lVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  UA_PublishResponseEntry **ppUVar14;
  UA_DataType *pUVar15;
  UA_Service p_Var16;
  size_t sVar17;
  UA_UInt32 UVar18;
  UA_PublishResponseEntry *pUVar19;
  UA_SecureChannel *pUVar20;
  UA_StatusCode UVar21;
  UA_CreateSessionRequest *request_00;
  UA_CreateSessionResponse *response_00;
  UA_DateTime UVar22;
  char *pcVar23;
  ulong uVar24;
  UA_NodeId *token;
  UA_AsymmetricAlgorithmSecurityHeader *pUVar25;
  ulong uVar26;
  size_t sStack_300;
  UA_Byte *pUStack_2f8;
  size_t sStack_2f0;
  UA_Byte *pUStack_2e8;
  size_t sStack_2e0;
  UA_EndpointDescription *pUStack_2d8;
  size_t sStack_2d0;
  UA_SignedSoftwareCertificate *pUStack_2c8;
  size_t sStack_2c0;
  UA_Byte *pUStack_2b8;
  size_t sStack_2b0;
  UA_Byte *pUStack_2a8;
  UA_UInt32 aUStack_2a0 [2];
  undefined1 auStack_298 [92];
  uint local_23c;
  UA_Logger local_238;
  uint local_22c;
  UA_Logger local_228;
  uint local_21c;
  UA_Logger local_218;
  uint local_20c;
  UA_Logger local_208;
  uint local_1fc;
  UA_Logger local_1f8;
  UA_Byte *local_1f0;
  anon_union_16_4_621dfe33_for_identifier local_1e8;
  undefined1 local_1d8 [8];
  UA_Session anonymousSession;
  UA_Session *session;
  void *response;
  UA_RequestHeader *requestHeader;
  void *request;
  UA_DataType *pUStack_a0;
  UA_Boolean sessionRequired;
  UA_DataType *responseType;
  UA_DataType *requestType;
  UA_Service service;
  size_t requestPos;
  undefined1 local_78 [4];
  UA_StatusCode retval;
  UA_NodeId requestTypeId;
  size_t *offset;
  size_t ppos;
  UA_ByteString *msg_local;
  UA_PublishResponseEntry *pUStack_40;
  UA_UInt32 requestId_local;
  UA_SecureChannel *channel_local;
  UA_Server *server_local;
  
  offset = (size_t *)0x0;
  requestTypeId.identifier.string.data = (UA_Byte *)&offset;
  aUStack_2a0[0] = 0x141444;
  aUStack_2a0[1] = 0;
  ppos = (size_t)msg;
  msg_local._4_4_ = requestId;
  pUStack_40 = (UA_PublishResponseEntry *)channel;
  channel_local = (UA_SecureChannel *)server;
  requestPos._4_4_ =
       UA_NodeId_decodeBinary
                 (msg,(size_t *)requestTypeId.identifier.string.data,(UA_NodeId *)local_78);
  if (requestPos._4_4_ == 0) {
    if (retval != 0) {
      aUStack_2a0[0] = 0x141461;
      aUStack_2a0[1] = 0;
      UA_NodeId_deleteMembers((UA_NodeId *)local_78);
    }
    service = *(UA_Service *)requestTypeId.identifier.string.data;
    requestType = (UA_DataType *)0x0;
    responseType = (UA_DataType *)0x0;
    pUStack_a0 = (UA_DataType *)0x0;
    request._7_1_ = 1;
    aUStack_2a0[0] = 0x1414b8;
    aUStack_2a0[1] = 0;
    getServicePointers(requestTypeId._0_4_,&responseType,&stack0xffffffffffffff60,
                       (UA_Service *)&requestType,(UA_Boolean *)((long)&request + 7));
    sVar17 = ppos;
    uVar12 = requestTypeId.identifier.string.data;
    pUVar15 = responseType;
    if (responseType == (UA_DataType *)0x0) {
      if (requestTypeId._0_4_ == 0x313) {
        local_1f8 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
        if ((pUStack_40->response).notificationMessage.publishTime == 0) {
          local_1fc = 0;
        }
        else {
          local_1fc = *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38);
        }
        aUStack_2a0[0] = 0x141537;
        aUStack_2a0[1] = 0;
        UA_LOG_INFO(local_1f8,UA_LOGCATEGORY_SECURECHANNEL,
                    "Connection %i | SecureChannel %i | Client requested a subscription, but those are not enabled in the build"
                    ,(ulong)local_1fc,
                    (ulong)((UA_ChannelSecurityToken *)&pUStack_40->requestId)->channelId);
      }
      else {
        local_208 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
        if ((pUStack_40->response).notificationMessage.publishTime == 0) {
          local_20c = 0;
        }
        else {
          local_20c = *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38);
        }
        aUStack_2a0[0] = 0x1415a5;
        aUStack_2a0[1] = 0;
        UA_LOG_INFO(local_208,UA_LOGCATEGORY_SECURECHANNEL,
                    "Connection %i | SecureChannel %i | Unknown request with type identifier %i",
                    (ulong)local_20c,
                    (ulong)((UA_ChannelSecurityToken *)&pUStack_40->requestId)->channelId,
                    (ulong)(uint)requestTypeId._0_4_);
      }
      aUStack_2a0[0] = 0x1415ce;
      aUStack_2a0[1] = 0;
      sendError((UA_SecureChannel *)pUStack_40,(UA_ByteString *)ppos,(size_t)service,UA_TYPES + 0x90
                ,msg_local._4_4_,0x800b0000);
    }
    else {
      if (pUStack_a0 == (UA_DataType *)0x0) {
        aUStack_2a0[0] = 0x1415fe;
        aUStack_2a0[1] = 0;
        __assert_fail("responseType",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                      ,0x439c,
                      "void processMSG(UA_Server *, UA_SecureChannel *, UA_UInt32, const UA_ByteString *)"
                     );
      }
      lVar11 = -(ulong)(responseType->memSize + 0xf & 0xfffffff0);
      request_00 = (UA_CreateSessionRequest *)(auStack_298 + lVar11);
      *(undefined8 *)(auStack_298 + lVar11 + -8) = 0x14164a;
      requestPos._4_4_ =
           UA_decodeBinary((UA_ByteString *)sVar17,(size_t *)uVar12,request_00,pUVar15);
      pUVar15 = pUStack_a0;
      if (requestPos._4_4_ == 0) {
        response_00 = (UA_CreateSessionResponse *)
                      ((long)request_00 - (ulong)(pUStack_a0->memSize + 0xf & 0xfffffff0));
        *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x14171a;
        UA_init(response_00,pUVar15);
        pUVar20 = channel_local;
        pUVar19 = pUStack_40;
        anonymousSession.responseQueue.sqh_last = (UA_PublishResponseEntry **)0x0;
        if (responseType == UA_TYPES + 0x99) {
          *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141756;
          Service_CreateSession
                    ((UA_Server *)pUVar20,(UA_SecureChannel *)pUVar19,request_00,response_00);
        }
        else {
          *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x14176b;
          anonymousSession.responseQueue.sqh_last =
               (UA_PublishResponseEntry **)
               UA_SecureChannel_getSession((UA_SecureChannel *)pUVar19,(UA_NodeId *)request_00);
          if ((UA_Session *)anonymousSession.responseQueue.sqh_last == (UA_Session *)0x0) {
            pUVar25 = &channel_local->clientAsymAlgSettings;
            *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141790;
            anonymousSession.responseQueue.sqh_last =
                 (UA_PublishResponseEntry **)
                 UA_SessionManager_getSession((UA_SessionManager *)pUVar25,(UA_NodeId *)request_00);
          }
          pUVar20 = channel_local;
          pUVar19 = pUStack_40;
          ppUVar14 = anonymousSession.responseQueue.sqh_last;
          if (responseType == UA_TYPES + 0x53) {
            if (anonymousSession.responseQueue.sqh_last == (UA_PublishResponseEntry **)0x0) {
              p_Var10 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
              if ((pUStack_40->response).notificationMessage.publishTime == 0) {
                local_22c = 0;
              }
              else {
                local_22c = *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38)
                ;
              }
              uVar24 = (ulong)local_22c;
              uVar9 = pUStack_40->requestId;
              local_228 = p_Var10;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141827;
              UA_LOG_DEBUG(p_Var10,UA_LOGCATEGORY_SECURECHANNEL,
                           "Connection %i | SecureChannel %i | Trying to activate a session that is not known in the server"
                           ,uVar24,(ulong)uVar9);
              pUVar19 = pUStack_40;
              UVar18 = msg_local._4_4_;
              sVar17 = ppos;
              p_Var16 = service;
              pUVar15 = pUStack_a0;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141849;
              sendError((UA_SecureChannel *)pUVar19,(UA_ByteString *)sVar17,(size_t)p_Var16,pUVar15,
                        UVar18,0x80250000);
              pUVar15 = responseType;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x14185c;
              UA_deleteMembers(request_00,pUVar15);
              return;
            }
            *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141883;
            Service_ActivateSession
                      ((UA_Server *)pUVar20,(UA_SecureChannel *)pUVar19,(UA_Session *)ppUVar14,
                       (UA_ActivateSessionRequest *)request_00,
                       (UA_ActivateSessionResponse *)response_00);
          }
          else {
            if (anonymousSession.responseQueue.sqh_last == (UA_PublishResponseEntry **)0x0) {
              if ((request._7_1_ & 1) != 0) {
                p_Var10 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
                if ((pUStack_40->response).notificationMessage.publishTime == 0) {
                  local_23c = 0;
                }
                else {
                  local_23c = *(uint *)((pUStack_40->response).notificationMessage.publishTime +
                                       0x38);
                }
                uVar24 = (ulong)local_23c;
                uVar9 = pUStack_40->requestId;
                uVar8 = responseType->binaryEncodingId;
                local_238 = p_Var10;
                *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141917;
                UA_LOG_INFO(p_Var10,UA_LOGCATEGORY_SECURECHANNEL,
                            "Connection %i | SecureChannel %i | Service request %i without a valid session"
                            ,uVar24,(ulong)uVar9,(ulong)uVar8);
                pUVar19 = pUStack_40;
                UVar18 = msg_local._4_4_;
                sVar17 = ppos;
                p_Var16 = service;
                pUVar15 = pUStack_a0;
                *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141939;
                sendError((UA_SecureChannel *)pUVar19,(UA_ByteString *)sVar17,(size_t)p_Var16,
                          pUVar15,UVar18,0x80250000);
                pUVar15 = responseType;
                *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x14194c;
                UA_deleteMembers(request_00,pUVar15);
                return;
              }
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x14195d;
              UA_Session_init((UA_Session *)local_1d8);
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141979;
              UA_NODEID_GUID((UA_NodeId *)&local_1f0,0,(UA_Guid)ZEXT816((ulong)0));
              anonymousSession.authenticationToken.identifier.string.data = local_1f0;
              anonymousSession.sessionId.namespaceIndex = local_1e8.numeric._0_2_;
              anonymousSession.sessionId._2_2_ = local_1e8.numeric._2_2_;
              anonymousSession.sessionId.identifierType = local_1e8.string.length._4_4_;
              anonymousSession.sessionId.identifier.string.length = (size_t)local_1e8.string.data;
              anonymousSession.validTill = (UA_DateTime)pUStack_40;
              anonymousSession.responseQueue.sqh_last = (UA_PublishResponseEntry **)local_1d8;
            }
            ppUVar14 = anonymousSession.responseQueue.sqh_last;
            if (((request._7_1_ & 1) != 0) &&
               (((ulong)anonymousSession.responseQueue.sqh_last[0xf] & 1) == 0)) {
              p_Var10 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
              if (anonymousSession.responseQueue.sqh_last[0x1b] == (UA_PublishResponseEntry *)0x0) {
                auStack_298._72_4_ = 0;
              }
              else {
                if ((anonymousSession.responseQueue.sqh_last[0x1b]->response).notificationMessage.
                    publishTime == 0) {
                  auStack_298._76_4_ = 0;
                }
                else {
                  auStack_298._76_4_ =
                       *(uint *)((anonymousSession.responseQueue.sqh_last[0x1b]->response).
                                 notificationMessage.publishTime + 0x38);
                }
                auStack_298._72_4_ = auStack_298._76_4_;
              }
              auStack_298._68_4_ = auStack_298._72_4_;
              if (anonymousSession.responseQueue.sqh_last[0x1b] == (UA_PublishResponseEntry *)0x0) {
                auStack_298._64_4_ = 0;
              }
              else {
                auStack_298._64_4_ = anonymousSession.responseQueue.sqh_last[0x1b]->requestId;
              }
              uVar24 = (ulong)(uint)auStack_298._72_4_;
              uVar26 = (ulong)(uint)auStack_298._64_4_;
              uVar9 = *(uint *)(anonymousSession.responseQueue.sqh_last + 0x16);
              auStack_298._52_4_ =
                   ZEXT24(*(ushort *)((long)anonymousSession.responseQueue.sqh_last + 0xb6));
              auStack_298._56_4_ = ZEXT14(*(byte *)(anonymousSession.responseQueue.sqh_last + 0x17))
              ;
              bVar1 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xb9);
              bVar2 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xba);
              bVar3 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xbb);
              bVar4 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xbc);
              bVar5 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xbd);
              bVar6 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xbe);
              bVar7 = *(byte *)((long)anonymousSession.responseQueue.sqh_last + 0xbf);
              auStack_298._60_4_ = ZEXT24(responseType->binaryEncodingId);
              auStack_298._80_8_ = p_Var10;
              *(uint *)&response_00[-1].serverNonce.data =
                   (uint)*(ushort *)((long)anonymousSession.responseQueue.sqh_last + 0xb4);
              *(undefined4 *)&response_00[-1].serverCertificate.length = auStack_298._52_4_;
              *(undefined4 *)&response_00[-1].serverCertificate.data = auStack_298._56_4_;
              uVar13 = auStack_298._60_4_;
              *(uint *)&response_00[-1].serverEndpointsSize = (uint)bVar1;
              *(uint *)&response_00[-1].serverEndpoints = (uint)bVar2;
              *(uint *)&response_00[-1].serverSoftwareCertificatesSize = (uint)bVar3;
              *(uint *)&response_00[-1].serverSoftwareCertificates = (uint)bVar4;
              *(uint *)&response_00[-1].serverSignature.algorithm.length = (uint)bVar5;
              *(uint *)&response_00[-1].serverSignature.algorithm.data = (uint)bVar6;
              *(uint *)&response_00[-1].serverSignature.signature.length = (uint)bVar7;
              *(undefined4 *)&response_00[-1].serverSignature.signature.data = uVar13;
              response_00[-1].serverNonce.length = 0x141bc2;
              UA_LOG_INFO(p_Var10,UA_LOGCATEGORY_SESSION,
                          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Calling service %i on a non-activated session"
                          ,uVar24,uVar26,(ulong)uVar9);
              pUVar19 = pUStack_40;
              UVar18 = msg_local._4_4_;
              sVar17 = ppos;
              p_Var16 = service;
              pUVar15 = pUStack_a0;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141be8;
              sendError((UA_SecureChannel *)pUVar19,(UA_ByteString *)sVar17,(size_t)p_Var16,pUVar15,
                        UVar18,0x80270000);
              pUVar25 = &channel_local->clientAsymAlgSettings;
              token = (UA_NodeId *)(anonymousSession.responseQueue.sqh_last + 0x12);
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141c03;
              UA_SessionManager_removeSession((UA_SessionManager *)pUVar25,token);
              pUVar15 = responseType;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141c16;
              UA_deleteMembers(request_00,pUVar15);
              return;
            }
            if (anonymousSession.responseQueue.sqh_last[0x1b] != pUStack_40) {
              p_Var10 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
              if ((pUStack_40->response).notificationMessage.publishTime == 0) {
                auStack_298._36_4_ = 0;
              }
              else {
                auStack_298._36_4_ =
                     *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38);
              }
              uVar24 = (ulong)(uint)auStack_298._36_4_;
              uVar9 = pUStack_40->requestId;
              auStack_298._40_8_ = p_Var10;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141c9b;
              UA_LOG_DEBUG(p_Var10,UA_LOGCATEGORY_SECURECHANNEL,
                           "Connection %i | SecureChannel %i | Client tries to use an obsolete securechannel"
                           ,uVar24,(ulong)uVar9);
              pUVar19 = pUStack_40;
              UVar18 = msg_local._4_4_;
              sVar17 = ppos;
              p_Var16 = service;
              pUVar15 = pUStack_a0;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141cbd;
              sendError((UA_SecureChannel *)pUVar19,(UA_ByteString *)sVar17,(size_t)p_Var16,pUVar15,
                        UVar18,0x80220000);
              pUVar15 = responseType;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141cd0;
              UA_deleteMembers(request_00,pUVar15);
              return;
            }
            *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141ce1;
            UA_Session_updateLifetime((UA_Session *)ppUVar14);
            pUVar20 = channel_local;
            UVar18 = msg_local._4_4_;
            pUVar15 = requestType;
            ppUVar14 = anonymousSession.responseQueue.sqh_last;
            if (responseType == UA_TYPES + 0x6f) {
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141d11;
              Service_Publish((UA_Server *)pUVar20,(UA_Session *)ppUVar14,
                              (UA_PublishRequest *)request_00,UVar18);
              pUVar15 = responseType;
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141d24;
              UA_deleteMembers(request_00,pUVar15);
              return;
            }
            if (requestType == (UA_DataType *)0x0) {
              *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141d54;
              __assert_fail("service",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                            ,0x4403,
                            "void processMSG(UA_Server *, UA_SecureChannel *, UA_UInt32, const UA_ByteString *)"
                           );
            }
            *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141d76;
            (*(code *)pUVar15)(pUVar20,ppUVar14,request_00,response_00);
          }
        }
        (response_00->responseHeader).requestHandle = *(UA_UInt32 *)(auStack_298 + lVar11 + 0x20);
        *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141d8f;
        UVar22 = UA_DateTime_now();
        (response_00->responseHeader).timestamp = UVar22;
        pUVar19 = pUStack_40;
        UVar18 = msg_local._4_4_;
        pUVar15 = pUStack_a0;
        *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141db6;
        UVar21 = UA_SecureChannel_sendBinaryMessage
                           ((UA_SecureChannel *)pUVar19,UVar18,response_00,pUVar15);
        requestPos._4_4_ = UVar21;
        if (UVar21 != 0) {
          auStack_298._24_8_ = (channel_local->serverAsymAlgSettings).senderCertificate.data;
          if ((pUStack_40->response).notificationMessage.publishTime == 0) {
            auStack_298._20_4_ = 0;
          }
          else {
            auStack_298._20_4_ =
                 *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38);
          }
          auStack_298._12_4_ = auStack_298._20_4_;
          auStack_298._16_4_ = pUStack_40->requestId;
          *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141e24;
          pcVar23 = UA_StatusCode_name(UVar21);
          uVar12 = auStack_298._24_8_;
          uVar24 = (ulong)(uint)auStack_298._12_4_;
          uVar26 = (ulong)(uint)auStack_298._16_4_;
          *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141e4e;
          UA_LOG_INFO((UA_Logger)uVar12,UA_LOGCATEGORY_SECURECHANNEL,
                      "Connection %i | SecureChannel %i | Could not send the message over the SecureChannel with StatusCode %s"
                      ,uVar24,uVar26,pcVar23);
        }
        pUVar15 = responseType;
        *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141e61;
        UA_deleteMembers(request_00,pUVar15);
        pUVar15 = pUStack_a0;
        *(undefined8 *)&response_00[-1].maxRequestMessageSize = 0x141e74;
        UA_deleteMembers(response_00,pUVar15);
      }
      else {
        p_Var10 = (UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data;
        if ((pUStack_40->response).notificationMessage.publishTime == 0) {
          local_21c = 0;
        }
        else {
          local_21c = *(uint *)((pUStack_40->response).notificationMessage.publishTime + 0x38);
        }
        uVar24 = (ulong)local_21c;
        uVar9 = ((UA_ChannelSecurityToken *)&pUStack_40->requestId)->channelId;
        local_218 = p_Var10;
        *(undefined8 *)(auStack_298 + lVar11 + -8) = 0x1416bf;
        UA_LOG_DEBUG(p_Var10,UA_LOGCATEGORY_SECURECHANNEL,
                     "Connection %i | SecureChannel %i | Could not decode the request",uVar24,
                     (ulong)uVar9);
        pUVar19 = pUStack_40;
        UVar18 = msg_local._4_4_;
        sVar17 = ppos;
        UVar21 = requestPos._4_4_;
        p_Var16 = service;
        pUVar15 = pUStack_a0;
        *(undefined8 *)(auStack_298 + lVar11 + -8) = 0x1416df;
        sendError((UA_SecureChannel *)pUVar19,(UA_ByteString *)sVar17,(size_t)p_Var16,pUVar15,UVar18
                  ,UVar21);
      }
    }
  }
  return;
}

Assistant:

static void
processMSG(UA_Server *server, UA_SecureChannel *channel,
           UA_UInt32 requestId, const UA_ByteString *msg) {
    /* At 0, the nodeid starts... */
    size_t ppos = 0;
    size_t *offset = &ppos;

    /* Decode the nodeid */
    UA_NodeId requestTypeId;
    UA_StatusCode retval = UA_NodeId_decodeBinary(msg, offset, &requestTypeId);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    if(requestTypeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        UA_NodeId_deleteMembers(&requestTypeId); /* leads to badserviceunsupported */

    /* Store the start-position of the request */
    size_t requestPos = *offset;

    /* Get the service pointers */
    UA_Service service = NULL;
    const UA_DataType *requestType = NULL;
    const UA_DataType *responseType = NULL;
    UA_Boolean sessionRequired = true;
    getServicePointers(requestTypeId.identifier.numeric, &requestType,
                       &responseType, &service, &sessionRequired);
    if(!requestType) {
        if(requestTypeId.identifier.numeric == 787) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Client requested a subscription, " \
                                "but those are not enabled in the build");
        } else {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Unknown request with type identifier %i",
                                requestTypeId.identifier.numeric);
        }
        sendError(channel, msg, requestPos, &UA_TYPES[UA_TYPES_SERVICEFAULT],
                  requestId, UA_STATUSCODE_BADSERVICEUNSUPPORTED);
        return;
    }
    UA_assert(responseType);

#ifdef UA_ENABLE_NONSTANDARD_STATELESS
    /* Stateless extension: Sessions are optional */
    sessionRequired = false;
#endif

    /* Decode the request */
    void *request = UA_alloca(requestType->memSize);
    UA_RequestHeader *requestHeader = (UA_RequestHeader*)request;
    retval = UA_decodeBinary(msg, offset, request, requestType);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Could not decode the request");
        sendError(channel, msg, requestPos, responseType, requestId, retval);
        return;
    }

    /* Prepare the respone */
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_Session *session = NULL; /* must be initialized before goto send_response */

    /* CreateSession doesn't need a session */
    if(requestType == &UA_TYPES[UA_TYPES_CREATESESSIONREQUEST]) {
        Service_CreateSession(server, channel, request, response);
        goto send_response;
    }

    /* Find the matching session */
    session = UA_SecureChannel_getSession(channel, &requestHeader->authenticationToken);
    if(!session)
        session = UA_SessionManager_getSession(&server->sessionManager,
                                               &requestHeader->authenticationToken);

    if(requestType == &UA_TYPES[UA_TYPES_ACTIVATESESSIONREQUEST]) {
        if(!session) {
            UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                                 "Trying to activate a session that is " \
                                 "not known in the server");
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        Service_ActivateSession(server, channel, session, request, response);
        goto send_response;
    }

    /* Set an anonymous, inactive session for services that need no session */
    UA_Session anonymousSession;
    if(!session) {
        if(sessionRequired) {
            UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                                "Service request %i without a valid session",
                                requestType->binaryEncodingId);
            sendError(channel, msg, requestPos, responseType,
                      requestId, UA_STATUSCODE_BADSESSIONIDINVALID);
            UA_deleteMembers(request, requestType);
            return;
        }
        UA_Session_init(&anonymousSession);
        anonymousSession.sessionId = UA_NODEID_GUID(0, UA_GUID_NULL);
        anonymousSession.channel = channel;
        session = &anonymousSession;
    }

    /* Trying to use a non-activated session? */
    if(sessionRequired && !session->activated) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Calling service %i on a non-activated session",
                            requestType->binaryEncodingId);
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSESSIONNOTACTIVATED);
        UA_SessionManager_removeSession(&server->sessionManager,
                                        &session->authenticationToken);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* The session is bound to another channel */
    if(session->channel != channel) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel,
                             "Client tries to use an obsolete securechannel");
        sendError(channel, msg, requestPos, responseType,
                  requestId, UA_STATUSCODE_BADSECURECHANNELIDINVALID);
        UA_deleteMembers(request, requestType);
        return;
    }

    /* Update the session lifetime */
    UA_Session_updateLifetime(session);

#ifdef UA_ENABLE_SUBSCRIPTIONS
    /* The publish request is not answered immediately */
    if(requestType == &UA_TYPES[UA_TYPES_PUBLISHREQUEST]) {
        Service_Publish(server, session, request, requestId);
        UA_deleteMembers(request, requestType);
        return;
    }
#endif

    /* Call the service */
    UA_assert(service); /* For all services besides publish, the service pointer is non-NULL*/
    service(server, session, request, response);

 send_response:
    /* Send the response */
    ((UA_ResponseHeader*)response)->requestHandle = requestHeader->requestHandle;
    ((UA_ResponseHeader*)response)->timestamp = UA_DateTime_now();
    retval = UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);

    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_CHANNEL(server->config.logger, channel,
                            "Could not send the message over the SecureChannel "
                            "with StatusCode %s", UA_StatusCode_name(retval));

    /* Clean up */
    UA_deleteMembers(request, requestType);
    UA_deleteMembers(response, responseType);
}